

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

void refreshSimpleDateTime(QDateTimeData *d)

{
  QDateTimePrivate *pQVar1;
  uint uVar2;
  Int IVar3;
  
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar2 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar2 = (uint)(byte)pQVar1;
  }
  IVar3 = (uVar2 & 0xfffffff7) + (uint)((~uVar2 & 6) == 0) * 8;
  if ((uVar2 & 1) == 0) {
    (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = IVar3;
    return;
  }
  *(char *)d = (char)IVar3;
  return;
}

Assistant:

inline bool QDateTime::Data::isShort() const
{
    bool b = quintptr(d) & QDateTimePrivate::ShortData;

    // sanity check:
    Q_ASSERT(b || !d->m_status.testFlag(QDateTimePrivate::ShortData));

    // even if CanBeSmall = false, we have short data for a default-constructed
    // QDateTime object. But it's unlikely.
    if constexpr (CanBeSmall)
        return Q_LIKELY(b);
    return Q_UNLIKELY(b);
}